

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_insert_new_key_value_at
               (roaring_array_t *ra,int32_t i,uint16_t key,container_t *c,uint8_t typecode)

{
  roaring_array_t *in_RCX;
  undefined2 in_DX;
  int in_ESI;
  int *in_RDI;
  undefined1 in_R8B;
  undefined3 in_stack_ffffffffffffffe4;
  int32_t k;
  undefined1 uVar1;
  
  k = CONCAT13(in_R8B,in_stack_ffffffffffffffe4);
  extend_array(in_RCX,k);
  uVar1 = (undefined1)((uint)k >> 0x18);
  memmove((void *)(*(long *)(in_RDI + 4) + (long)(in_ESI + 1) * 2),
          (void *)(*(long *)(in_RDI + 4) + (long)in_ESI * 2),(long)(*in_RDI - in_ESI) << 1);
  memmove((void *)(*(long *)(in_RDI + 2) + (long)(in_ESI + 1) * 8),
          (void *)(*(long *)(in_RDI + 2) + (long)in_ESI * 8),(long)(*in_RDI - in_ESI) << 3);
  memmove((void *)(*(long *)(in_RDI + 6) + (long)(in_ESI + 1)),
          (void *)(*(long *)(in_RDI + 6) + (long)in_ESI),(long)(*in_RDI - in_ESI));
  *(undefined2 *)(*(long *)(in_RDI + 4) + (long)in_ESI * 2) = in_DX;
  *(roaring_array_t **)(*(long *)(in_RDI + 2) + (long)in_ESI * 8) = in_RCX;
  *(undefined1 *)(*(long *)(in_RDI + 6) + (long)in_ESI) = uVar1;
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

void ra_insert_new_key_value_at(roaring_array_t *ra, int32_t i, uint16_t key,
                                container_t *c, uint8_t typecode) {
    extend_array(ra, 1);
    // May be an optimization opportunity with DIY memmove
    memmove(&(ra->keys[i + 1]), &(ra->keys[i]),
            sizeof(uint16_t) * (ra->size - i));
    memmove(&(ra->containers[i + 1]), &(ra->containers[i]),
            sizeof(container_t *) * (ra->size - i));
    memmove(&(ra->typecodes[i + 1]), &(ra->typecodes[i]),
            sizeof(uint8_t) * (ra->size - i));
    ra->keys[i] = key;
    ra->containers[i] = c;
    ra->typecodes[i] = typecode;
    ra->size++;
}